

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  FieldDescriptor *message_00;
  LogMessage *pLVar1;
  Reflection *reflection;
  undefined1 local_b8 [8];
  TextGenerator generator;
  StringOutputStream output_stream;
  LogMessage local_68;
  string *local_30;
  string *output_local;
  FieldDescriptor *pFStack_20;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Printer *this_local;
  
  local_30 = output;
  output_local._4_4_ = index;
  pFStack_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x8a7);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: output: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"output specified is nullptr");
    internal::LogFinisher::operator=((LogFinisher *)((long)&output_stream.target_ + 3),pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  std::__cxx11::string::clear();
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&generator.indent_level_,local_30);
  TextGenerator::TextGenerator
            ((TextGenerator *)local_b8,(ZeroCopyOutputStream *)&generator.indent_level_,
             this->initial_indent_level_);
  message_00 = field_local;
  reflection = Message::GetReflection((Message *)field_local);
  PrintFieldValue(this,(Message *)message_00,reflection,pFStack_20,output_local._4_4_,
                  (TextGenerator *)local_b8);
  TextGenerator::~TextGenerator((TextGenerator *)local_b8);
  io::StringOutputStream::~StringOutputStream((StringOutputStream *)&generator.indent_level_);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}